

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::Switch::mousePressEvent(Switch *this,QMouseEvent *event)

{
  MouseButton MVar1;
  QPoint __addr_len;
  SwitchPrivate *pSVar2;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *event_local;
  Switch *this_local;
  
  __fd = (int)event;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)event);
  if (MVar1 == LeftButton) {
    __addr_len = QMouseEvent::pos(event);
    pSVar2 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    pSVar2->mousePos = __addr_len;
    pSVar2 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    pSVar2->leftMouseButtonPressed = true;
    pSVar2 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    pSVar2->mouseMoveDelta = 0;
    QEvent::accept((QEvent *)event,__fd,__addr,(socklen_t *)__addr_len);
  }
  else {
    QEvent::ignore((QEvent *)event);
  }
  return;
}

Assistant:

void
Switch::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;
		d->mouseMoveDelta = 0;

		event->accept();
	}
	else
		event->ignore();
}